

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

Vector<float,_2> __thiscall
deqp::gles3::Performance::mean<2>
          (Performance *this,
          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *data)

{
  int iVar1;
  size_type sVar2;
  const_reference v;
  Vector<float,_2> VVar3;
  float local_48;
  Vector<float,_2> local_2c;
  int local_24;
  int i;
  Vector<float,_2> sum;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *data_local;
  
  sum.m_data = (float  [2])data;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffffe0,0.0);
  for (local_24 = 0; iVar1 = local_24,
      sVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         sum.m_data), iVar1 < (int)sVar2; local_24 = local_24 + 1) {
    v = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   sum.m_data,(long)local_24);
    tcu::Vector<float,_2>::operator+=((Vector<float,_2> *)&stack0xffffffffffffffe0,v);
  }
  sVar2 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     sum.m_data);
  local_48 = (float)sVar2;
  tcu::Vector<float,_2>::Vector(&local_2c,local_48);
  VVar3 = tcu::operator/((tcu *)this,(Vector<float,_2> *)&stack0xffffffffffffffe0,&local_2c);
  return (Vector<float,_2>)VVar3.m_data;
}

Assistant:

static tcu::Vector<float, N> mean (const vector<tcu::Vector<float, N> >& data)
{
	tcu::Vector<float, N> sum(0.0f);
	for (int i = 0; i < (int)data.size(); i++)
		sum += data[i];
	return sum / tcu::Vector<float, N>((float)data.size());
}